

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qteamcitylogger.cpp
# Opt level: O0

void __thiscall
QTeamCityLogger::addMessage
          (QTeamCityLogger *this,MessageTypes type,QString *message,char *file,int line)

{
  int iVar1;
  QTestCharBuffer *this_00;
  char *in_RCX;
  QTeamCityLogger *in_RDX;
  MessageTypes in_ESI;
  char *in_RDI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  QTestCharBuffer escapedMessage;
  QString *in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffd9c;
  QTeamCityLogger *in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda8;
  QTestCharBuffer local_218;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_ESI == QFatal) || (iVar1 = QTestLog::verboseLevel(), -1 < iVar1)) {
    memset(&local_218,0xaa,0x210);
    QTestCharBuffer::QTestCharBuffer(&local_218);
    QtPrivate::asString((QString *)in_RDX);
    QString::toUtf8(in_stack_fffffffffffffd68);
    QByteArray::constData((QByteArray *)0x143056);
    tcEscapedString(in_stack_fffffffffffffda0,
                    (QTestCharBuffer *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98)
                    ,in_RDI);
    QByteArray::~QByteArray((QByteArray *)0x143077);
    QTest::tcMessageType2String(in_ESI);
    this_00 = (QTestCharBuffer *)QTestCharBuffer::constData(&local_218);
    addPendingMessage(in_RDX,in_RCX,(char *)CONCAT44(in_R8D,in_stack_fffffffffffffda8),
                      (char *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c);
    QTestCharBuffer::~QTestCharBuffer(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTeamCityLogger::addMessage(MessageTypes type, const QString &message,
                                 const char *file, int line)
{
    // suppress non-fatal messages in silent mode
    if (type != QFatal && QTestLog::verboseLevel() < 0)
        return;

    QTestCharBuffer escapedMessage;
    tcEscapedString(&escapedMessage, qUtf8Printable(message));
    addPendingMessage(QTest::tcMessageType2String(type), escapedMessage.constData(), file, line);
}